

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O2

int Saig_ManBmcLiteral(Gia_ManBmc_t *p,Aig_Obj_t *pObj,int iFrame)

{
  int iVar1;
  int *piVar2;
  Vec_Int_t *p_00;
  
  if (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7) {
    piVar2 = Saig_ManBmcMapping(p,pObj);
    if (piVar2 == (int *)0x0) {
      __assert_fail("!Aig_ObjIsNode(pObj) || Saig_ManBmcMapping(p, pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                    ,0x36d,"int Saig_ManBmcLiteral(Gia_ManBmc_t *, Aig_Obj_t *, int)");
    }
  }
  iVar1 = Vec_IntEntry(p->vId2Num,pObj->Id);
  if (-1 < iVar1) {
    p_00 = (Vec_Int_t *)Vec_PtrEntry(p->vId2Var,iFrame);
    if (p_00 != (Vec_Int_t *)0x0) {
      iVar1 = Vec_IntEntry(p_00,iVar1);
      return iVar1;
    }
    __assert_fail("vFrame != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                  ,0x371,"int Saig_ManBmcLiteral(Gia_ManBmc_t *, Aig_Obj_t *, int)");
  }
  __assert_fail("ObjNum >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmc3.c"
                ,0x36f,"int Saig_ManBmcLiteral(Gia_ManBmc_t *, Aig_Obj_t *, int)");
}

Assistant:

static inline int Saig_ManBmcLiteral( Gia_ManBmc_t * p, Aig_Obj_t * pObj, int iFrame )
{
    Vec_Int_t * vFrame;
    int ObjNum;
    assert( !Aig_ObjIsNode(pObj) || Saig_ManBmcMapping(p, pObj) );
    ObjNum  = Vec_IntEntry( p->vId2Num, Aig_ObjId(pObj) );
    assert( ObjNum >= 0 );
    vFrame  = (Vec_Int_t *)Vec_PtrEntry( p->vId2Var, iFrame );
    assert( vFrame != NULL );
    return Vec_IntEntry( vFrame, ObjNum );
}